

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O1

int do_decompress(Dwarf_Debug dbg,Dwarf_Section_s *section,Dwarf_Error *error)

{
  Dwarf_Small *__s2;
  Dwarf_Unsigned DVar1;
  bool bVar2;
  dwarfstring_u v;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Dwarf_Small *pDVar6;
  char *pcVar7;
  Dwarf_Signed DVar8;
  ulong __size;
  Dwarf_Small *pDVar9;
  Dwarf_Unsigned DVar10;
  bool bVar11;
  Dwarf_Unsigned _ltmp;
  dwarfstring m;
  dwarfstring_u local_b8 [13];
  dwarfstring_s local_50;
  
  DVar10 = section->dss_size;
  if ((long)DVar10 < 0xc) {
    pcVar7 = "DW_DLE_ZLIB_SECTION_SHORTSection too short to be either zlib or zstd related";
    DVar8 = 0x152;
    goto LAB_001ad8c7;
  }
  __s2 = section->dss_data;
  DVar1 = section->dss_flags;
  pDVar6 = __s2 + DVar10;
  section->dss_compressed_length = DVar10;
  iVar3 = strncmp("ZLIB",(char *)__s2,4);
  if (iVar3 == 0) {
    pDVar9 = __s2 + 0xc;
    lVar4 = 0;
    __size = 0;
    do {
      __size = (ulong)__s2[lVar4 + 4] | __size << 8;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 8);
    DVar10 = DVar10 - 0xc;
    section->dss_uncompressed_length = __size;
    section->dss_ZLIB_compressed = '\x01';
    bVar2 = false;
  }
  else {
    if (((uint)DVar1 >> 0xb & 1) == 0) {
      pcVar7 = "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD The compressed section is not properly formatted";
      DVar8 = 0x13b;
      goto LAB_001ad8c7;
    }
    uVar5 = (ulong)dbg->de_pointer_size;
    local_b8[0] = 0;
    (*dbg->de_copy_word)(local_b8,__s2,4);
    v = local_b8[0];
    local_b8[0] = 0;
    pDVar9 = __s2;
    if (pDVar6 < __s2 + uVar5 + uVar5) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      bVar11 = false;
      bVar2 = false;
      __size = 0;
    }
    else {
      (*dbg->de_copy_word)(local_b8,__s2 + uVar5,uVar5);
      if (v == 1) {
        bVar2 = false;
      }
      else {
        if (v != 2) {
          dwarfstring_constructor_static(&local_50,(char *)local_b8,100);
          dwarfstring_append_printf_u
                    (&local_50,
                     "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD The SHF_COMPRESSED type field is 0x%x, neither zlib (1) or zstd(2). Corrupt dwarf."
                     ,v);
          pcVar7 = dwarfstring_string(&local_50);
          _dwarf_error_string(dbg,error,0x13b,pcVar7);
          dwarfstring_destructor(&local_50);
          bVar11 = false;
          __size = 0;
          bVar2 = false;
          goto LAB_001ad83e;
        }
        bVar2 = true;
      }
      section->dss_uncompressed_length = local_b8[0];
      DVar10 = DVar10 + uVar5 * -3;
      section->dss_shf_compressed = '\x01';
      bVar11 = true;
      __size = local_b8[0];
      pDVar9 = __s2 + uVar5 * 3;
    }
LAB_001ad83e:
    if (!bVar11) {
      return 1;
    }
  }
  uVar5 = DVar10 << 4;
  bVar11 = DVar10 >> 1 <= __size;
  if (bVar2) {
    if (bVar11 || DVar10 < 0x33) {
      if (uVar5 < DVar10) {
        pcVar7 = 
        "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  is absurdly large so arithmentic overflow. So corrupt dwarf"
        ;
      }
      else {
        if (__size <= uVar5) {
LAB_001ad8e6:
          if (pDVar6 < pDVar9 + DVar10) {
            pcVar7 = 
            "DW_DLE_ZDEBUG_ZLIB_SECTION_SHORT The zstd or zlib compressed section  is longer than the section length. So corrupt dwarf"
            ;
            DVar8 = 0x152;
          }
          else {
            pDVar6 = (Dwarf_Small *)malloc(__size);
            if (pDVar6 == (Dwarf_Small *)0x0) {
              pcVar7 = 
              "DW_DLE_ALLOC_FAIL The zstd or zlib uncompressed space malloc failed: out of memory";
              DVar8 = 0x3e;
            }
            else {
              if (!bVar2) {
                local_b8[0] = __size;
                iVar3 = uncompress(pDVar6,local_b8,pDVar9,DVar10);
                if (iVar3 == -5) {
                  DVar8 = 0x13c;
                }
                else {
                  if (iVar3 == 0) goto LAB_001ad990;
                  if (iVar3 == -4) {
                    DVar8 = 0x3e;
                  }
                  else {
                    DVar8 = 0x13d;
                  }
                }
                free(pDVar6);
                _dwarf_error(dbg,error,DVar8);
                return 1;
              }
              uVar5 = ZSTD_decompress(pDVar6,__size,pDVar9,DVar10);
              if (uVar5 == __size) {
LAB_001ad990:
                section->dss_data = pDVar6;
                section->dss_size = __size;
                section->dss_data_was_malloc = '\x01';
                section->dss_did_decompress = '\x01';
                return 0;
              }
              free(pDVar6);
              pcVar7 = "DW_DLE_ZLIB_DATA_ERROR The zstd ZSTD_decompress() failed.";
              DVar8 = 0x13d;
            }
          }
          goto LAB_001ad8c7;
        }
        pcVar7 = 
        "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  is absurdly large given the input section length. So corrupt dwarf"
        ;
      }
    }
    else {
      pcVar7 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  isabsurdly small. Corrupt dwarf";
    }
  }
  else if (bVar11 || DVar10 < 0x33) {
    if (uVar5 < DVar10) {
      pcVar7 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR: The zlib compressed section  is absurdly large so arithmentic overflow. So corrupt dwarf"
      ;
    }
    else {
      if (__size <= uVar5) goto LAB_001ad8e6;
      pcVar7 = 
      "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zlib compressed section  is absurdly large given the input section length. So corrupt dwarf"
      ;
    }
  }
  else {
    pcVar7 = 
    "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zlib compressed section  isabsurdly small. Corrupt dwarf";
  }
  DVar8 = 0x170;
LAB_001ad8c7:
  _dwarf_error_string(dbg,error,DVar8,pcVar7);
  return 1;
}

Assistant:

static int
do_decompress(Dwarf_Debug dbg,
    struct Dwarf_Section_s *section,
    Dwarf_Error * error)
{
    Dwarf_Small *basesrc = section->dss_data;
    Dwarf_Small *src = basesrc;
    Dwarf_Small *dest = 0;
    Dwarf_Unsigned destlen = 0;
    Dwarf_Unsigned srclen = section->dss_size;
    Dwarf_Unsigned flags = section->dss_flags;
    Dwarf_Small *endsection = 0;
    int zstdcompress = FALSE;
    Dwarf_Unsigned uncompressed_len = 0;

    endsection = basesrc + section->dss_size;
    if ((basesrc + 12) > endsection) {
        _dwarf_error_string(dbg, error,DW_DLE_ZLIB_SECTION_SHORT,
            "DW_DLE_ZLIB_SECTION_SHORT"
            "Section too short to be either zlib or zstd related");
        return DW_DLV_ERROR;
    }
    section->dss_compressed_length = srclen;
    if (!strncmp("ZLIB",(const char *)src,4)) {
        unsigned i = 0;
        unsigned l = 8;
        unsigned char *c = src+4;
        for ( ; i < l; ++i,c++) {
            uncompressed_len <<= 8;
            uncompressed_len += *c;
        }
        src = src + 12;
        srclen -= 12;
        section->dss_uncompressed_length = uncompressed_len;
        section->dss_ZLIB_compressed = TRUE;
    } else  if (flags & SHF_COMPRESSED) {
        /*  The prefix is a struct:
            unsigned int type; followed by pad if following are 64bit!
            size-of-target-address size
            size-of-target-address
        */
        Dwarf_Small *ptr    = (Dwarf_Small *)src;
        Dwarf_Unsigned type = 0;
        Dwarf_Unsigned size = 0;
        /* Dwarf_Unsigned addralign = 0; */
        unsigned fldsize    = dbg->de_pointer_size;
        unsigned structsize = 3* fldsize;
        READ_UNALIGNED_CK(dbg,type,Dwarf_Unsigned,ptr,
            DWARF_32BIT_SIZE,
            error,endsection);
        ptr += fldsize;
        READ_UNALIGNED_CK(dbg,size,Dwarf_Unsigned,ptr,fldsize,
            error,endsection);
        switch(type) {
        case ELFCOMPRESS_ZLIB:
            break;
        case ELFCOMPRESS_ZSTD:
            zstdcompress = TRUE;
            break;
        default: {
            char buf[100];
            dwarfstring m;

            dwarfstring_constructor_static(&m,buf,sizeof(buf));
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD"
                " The SHF_COMPRESSED type field is 0x%x, neither"
                " zlib (1) or zstd(2). Corrupt dwarf.", type);
            _dwarf_error_string(dbg, error,
                DW_DLE_ZDEBUG_INPUT_FORMAT_ODD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        }
        uncompressed_len = size;
        section->dss_uncompressed_length = uncompressed_len;
        src    += structsize;
        srclen -= structsize;
        section->dss_shf_compressed = TRUE;
    } else {
        _dwarf_error_string(dbg, error,
            DW_DLE_ZDEBUG_INPUT_FORMAT_ODD,
            "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD"
            " The compressed section is not properly formatted");
        return DW_DLV_ERROR;
    }
    if (!zstdcompress) {
        /*  According to zlib.net zlib essentially never expands
            the data when compressing.  There is no statement
            about  any effective limit in the compression factor
            though we, here, assume  such a limit to check
            for sanity in the object file.
            These tests are heuristics.  */
        Dwarf_Unsigned max_inflated_len =
            srclen*ALLOWED_ZLIB_INFLATION;

        if (srclen > 50)  {
            /*  If srclen not super tiny lets check the following. */
            if (uncompressed_len < (srclen/2)) {
                /*  Violates the approximate invariant about
                    compression not actually inflating. */
                _dwarf_error_string(dbg, error,
                    DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                    "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                    " The zlib compressed section  is"
                    "absurdly small. Corrupt dwarf");
                return DW_DLV_ERROR;
            }
        }
        if (max_inflated_len < srclen) {
            /* The calculation overflowed. */
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR:"
                " The zlib compressed section  is"
                " absurdly large so arithmentic overflow."
                " So corrupt dwarf");
            return DW_DLV_ERROR;
        }
        if (uncompressed_len > max_inflated_len) {
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zlib compressed section  is"
                " absurdly large given the input section"
                " length. So corrupt dwarf");
            return DW_DLV_ERROR;
        }
    }
    if (zstdcompress) {
        /*  According to zlib.net zlib essentially never expands
            the data when compressing.  There is no statement
            about  any effective limit in the compression factor
            though we, here, assume  such a limit to check
            for sanity in the object file.
            These tests are heuristics.  */
        Dwarf_Unsigned max_inflated_len =
            srclen*ALLOWED_ZSTD_INFLATION;

        if (srclen > 50)  {
            /*  If srclen not super tiny lets check the following. */
            if (uncompressed_len < (srclen/2)) {
                /*  Violates the approximate invariant about
                    compression not actually inflating. */
                _dwarf_error_string(dbg, error,
                    DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                    "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                    " The zstd compressed section  is"
                    "absurdly small. Corrupt dwarf");
                return DW_DLV_ERROR;
            }
        }
        if (max_inflated_len < srclen) {
            /* The calculation overflowed. */
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zstd compressed section  is"
                " absurdly large so arithmentic overflow."
                " So corrupt dwarf");
            return DW_DLV_ERROR;
        }
        if (uncompressed_len > max_inflated_len) {
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zstd compressed section  is"
                " absurdly large given the input section"
                " length. So corrupt dwarf");
            return DW_DLV_ERROR;
        }
    }
    if ((src +srclen) > endsection) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ZLIB_SECTION_SHORT,
            "DW_DLE_ZDEBUG_ZLIB_SECTION_SHORT"
            " The zstd or zlib compressed section  is"
            " longer than the section"
            " length. So corrupt dwarf");
        return DW_DLV_ERROR;
    }
    destlen = uncompressed_len;
    dest = malloc(destlen);
    if (!dest) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ALLOC_FAIL,
            "DW_DLE_ALLOC_FAIL"
            " The zstd or zlib uncompressed space"
            " malloc failed: out of memory");
        return DW_DLV_ERROR;
    }
    /*  uncompress is a zlib function. */
    if (!zstdcompress) {
        int res = 0;
        uLongf dlen = destlen;

        res = uncompress(dest,&dlen,src,srclen);
        if (res == Z_BUF_ERROR) {
            free(dest);
            DWARF_DBG_ERROR(dbg, DW_DLE_ZLIB_BUF_ERROR, DW_DLV_ERROR);
        } else if (res == Z_MEM_ERROR) {
            free(dest);
            DWARF_DBG_ERROR(dbg, DW_DLE_ALLOC_FAIL, DW_DLV_ERROR);
        } else if (res != Z_OK) {
            free(dest);
            /* Probably Z_DATA_ERROR. */
            DWARF_DBG_ERROR(dbg, DW_DLE_ZLIB_DATA_ERROR,
                DW_DLV_ERROR);
        }
    }
    if (zstdcompress) {
        size_t zsize =
            ZSTD_decompress(dest,destlen,src,srclen);
        if (zsize != destlen) {
            free(dest);
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_DATA_ERROR,
                "DW_DLE_ZLIB_DATA_ERROR"
                " The zstd ZSTD_decompress() failed.");
            return DW_DLV_ERROR;
        }
    }
    /* Z_OK */
    section->dss_data = dest;
    section->dss_size = destlen;
    section->dss_data_was_malloc = TRUE;
    section->dss_did_decompress = TRUE;
    return DW_DLV_OK;
}